

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ss_mintrosort(uchar *T,int *PA,int *first,int *last,int depth)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  uchar *puVar7;
  uchar *puVar8;
  ulong uVar9;
  uint *puVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  uint *puVar14;
  uint *puVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint *puVar20;
  byte bVar21;
  ulong uVar22;
  uint *puVar23;
  byte *pbVar24;
  ulong uVar25;
  uchar *puVar26;
  uint *puVar27;
  byte bVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  byte *pbVar32;
  ulong uVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  byte *pbVar37;
  ulong uVar38;
  ulong uVar39;
  uint *puVar40;
  ulong uVar41;
  long lVar42;
  bool bVar43;
  bool bVar44;
  anon_struct_24_4_d8a55aef stack [16];
  uint *local_210;
  uint *local_1d0;
  ulong auStack_1b8 [2];
  int aiStack_1a8 [94];
  
  uVar31 = (uint)((long)last - (long)first);
  if (((long)last - (long)first & 0x3fc00U) == 0) {
    iVar29 = *(int *)((long)lg_table + (ulong)(uVar31 & 0x3fc));
  }
  else {
    iVar29 = *(int *)((long)lg_table + (ulong)(uVar31 >> 8 & 0x3fc)) + 8;
  }
  uVar22 = 0;
  iVar35 = 2;
LAB_001dcb68:
  do {
    uVar41 = (long)last - (long)first;
    uVar39 = (long)uVar41 >> 2;
    puVar10 = (uint *)last;
    local_210 = (uint *)first;
    iVar13 = iVar29;
    if ((long)uVar39 < 9) {
      uVar22 = uVar22 & 0xffffffff;
      do {
        if ((1 < (long)uVar39) && (puVar10 = (uint *)last + -2, first <= puVar10)) {
          puVar26 = T + iVar35;
          do {
            uVar31 = *puVar10;
            uVar17 = puVar10[1];
            puVar15 = puVar10 + 1;
            while( true ) {
              lVar42 = (long)PA[(int)uVar31];
              lVar36 = (long)PA[(int)uVar17];
              pbVar32 = puVar26 + lVar42;
              pbVar37 = puVar26 + lVar36;
              pbVar24 = T + (long)PA[(long)(int)uVar17 + 1] + 2;
              bVar43 = pbVar37 < pbVar24;
              bVar44 = pbVar32 < T + (long)PA[(long)(int)uVar31 + 1] + 2;
              puVar14 = puVar15;
              if ((bVar44) && (puVar7 = puVar26, pbVar37 < pbVar24)) {
                do {
                  bVar11 = puVar7[lVar42];
                  bVar28 = puVar7[lVar36];
                  if (bVar11 != bVar28) goto LAB_001dcc49;
                  pbVar32 = puVar7 + lVar36 + 1;
                  bVar43 = pbVar32 < pbVar24;
                  puVar8 = puVar7 + 1;
                  bVar44 = puVar7 + lVar42 + 1 < T + (long)PA[(long)(int)uVar31 + 1] + 2;
                } while ((bVar44) && (puVar7 = puVar8, pbVar32 < pbVar24));
                pbVar32 = puVar8 + lVar42;
                pbVar37 = puVar8 + lVar36;
              }
              if (!bVar44) break;
              if (bVar43 != false) {
                bVar11 = *pbVar32;
                bVar28 = *pbVar37;
LAB_001dcc49:
                iVar29 = (uint)bVar11 - (uint)bVar28;
                if (iVar29 == 0 || (uint)bVar11 < (uint)bVar28) goto LAB_001dcc80;
              }
              do {
                puVar15 = puVar14 + 1;
                puVar14[-1] = uVar17;
                if (last <= puVar15) goto LAB_001dcc8e;
                uVar17 = *puVar15;
                puVar14 = puVar15;
              } while ((int)uVar17 < 0);
            }
            iVar29 = -(uint)bVar43;
LAB_001dcc80:
            if (iVar29 == 0) {
              *puVar15 = ~uVar17;
            }
LAB_001dcc8e:
            puVar15[-1] = uVar31;
            puVar10 = puVar10 + -1;
          } while (first <= puVar10);
        }
        if ((int)uVar22 < 0) {
          __assert_fail("0 <= ssize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb65e,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        bVar44 = uVar22 == 0;
        uVar22 = uVar22 - 1;
        if (bVar44) {
          return;
        }
        first = (int *)auStack_1b8[uVar22 * 3];
        last = (int *)auStack_1b8[uVar22 * 3 + 1];
        iVar35 = aiStack_1a8[uVar22 * 6];
        uVar41 = (long)last - (long)first;
        uVar39 = (long)uVar41 >> 2;
      } while ((long)uVar39 < 9);
      puVar10 = (uint *)last;
      local_210 = (uint *)first;
      iVar13 = aiStack_1a8[uVar22 * 6 + 1];
    }
    iVar29 = iVar13 + -1;
    if (iVar13 == 0) {
      iVar34 = (int)uVar39;
      uVar38 = uVar39 & 0xffffffff;
      if ((uVar39 & 1) == 0) {
        uVar38 = (ulong)(iVar34 - 1U);
        iVar12 = (iVar34 - ((int)(iVar34 - 1U) >> 0x1f)) + -1 >> 1;
        uVar31 = local_210[(long)iVar34 + -1];
        if (T[(long)PA[(int)local_210[iVar12]] + (long)iVar35] <
            T[(long)PA[(int)uVar31] + (long)iVar35]) {
          local_210[(long)iVar34 + -1] = local_210[iVar12];
          local_210[iVar12] = uVar31;
        }
      }
      iVar34 = (int)uVar38;
      if (1 < iVar34) {
        uVar33 = uVar38 >> 1;
        do {
          uVar1 = uVar33 - 1;
          uVar31 = local_210[uVar33 - 1];
          uVar19 = uVar33 * 2 - 1;
          uVar9 = uVar1;
          if (uVar19 < uVar38) {
            bVar11 = T[(long)PA[(int)uVar31] + (long)iVar35];
            uVar25 = uVar33 * 2 - 2;
            uVar9 = uVar1 & 0xffffffff;
            do {
              bVar28 = T[(long)PA[(int)local_210[(int)uVar19]] + (long)iVar35];
              bVar2 = T[(long)PA[(int)local_210[(long)(int)uVar25 + 2]] + (long)iVar35];
              bVar21 = bVar2;
              if (bVar2 < bVar28) {
                bVar21 = bVar28;
              }
              iVar12 = (int)uVar9;
              if (bVar21 <= bVar11) break;
              if (bVar28 < bVar2) {
                uVar19 = (ulong)((int)uVar25 + 2);
              }
              iVar18 = (int)uVar19;
              uVar9 = uVar19 & 0xffffffff;
              local_210[iVar12] = local_210[iVar18];
              uVar17 = iVar18 * 2 + 1;
              uVar19 = (ulong)uVar17;
              uVar25 = (ulong)(uint)(iVar18 * 2);
            } while ((int)uVar17 < iVar34);
          }
          local_210[(int)uVar9] = uVar31;
          bVar44 = 1 < (long)uVar33;
          uVar33 = uVar1;
        } while (bVar44);
      }
      if ((uVar39 & 1) == 0) {
        uVar31 = *local_210;
        *local_210 = local_210[iVar34];
        local_210[iVar34] = uVar31;
        uVar31 = *local_210;
        if (iVar34 < 2) {
          lVar36 = 0;
        }
        else {
          bVar11 = T[(long)PA[(int)uVar31] + (long)iVar35];
          iVar12 = 0;
          iVar6 = 1;
          iVar18 = 0;
          do {
            bVar28 = T[(long)PA[(int)local_210[iVar6]] + (long)iVar35];
            bVar2 = T[(long)PA[(int)local_210[(long)iVar12 + 2]] + (long)iVar35];
            bVar21 = bVar2;
            if (bVar2 < bVar28) {
              bVar21 = bVar28;
            }
            if (bVar21 <= bVar11) {
              lVar36 = (long)iVar18;
              break;
            }
            iVar30 = iVar6;
            if (bVar28 < bVar2) {
              iVar30 = iVar12 + 2;
            }
            lVar36 = (long)iVar30;
            local_210[iVar18] = local_210[lVar36];
            iVar12 = iVar30 * 2;
            iVar6 = iVar30 * 2 + 1;
            iVar18 = iVar30;
          } while (iVar6 < iVar34);
        }
        local_210[lVar36] = uVar31;
      }
      if (1 < iVar34) {
        uVar31 = *local_210;
        puVar15 = local_210 + (uVar38 - 1);
        uVar17 = *puVar15;
        *local_210 = uVar17;
        while (uVar39 = uVar38 - 1, 1 < uVar39) {
          bVar11 = T[(long)PA[(int)uVar17] + (long)iVar35];
          iVar34 = 0;
          iVar18 = 1;
          iVar12 = 0;
          do {
            bVar28 = T[(long)PA[(int)local_210[iVar18]] + (long)iVar35];
            bVar2 = T[(long)PA[(int)local_210[(long)iVar34 + 2]] + (long)iVar35];
            bVar21 = bVar2;
            if (bVar2 < bVar28) {
              bVar21 = bVar28;
            }
            if (bVar21 <= bVar11) {
              lVar36 = (long)iVar12;
              break;
            }
            iVar6 = iVar18;
            if (bVar28 < bVar2) {
              iVar6 = iVar34 + 2;
            }
            lVar36 = (long)iVar6;
            local_210[iVar12] = local_210[lVar36];
            iVar34 = iVar6 * 2;
            iVar18 = iVar6 * 2 + 1;
            iVar12 = iVar6;
          } while ((long)iVar18 < (long)uVar39);
          local_210[lVar36] = uVar17;
          *puVar15 = uVar31;
          uVar31 = *local_210;
          puVar15 = local_210 + (uVar38 - 2);
          uVar17 = *puVar15;
          *local_210 = uVar17;
          uVar38 = uVar39;
        }
        *puVar15 = uVar31;
      }
    }
    iVar34 = (int)uVar22;
    last = (int *)puVar10;
    if (iVar13 < 1) {
      lVar36 = (long)PA[(int)*local_210];
      bVar11 = T[lVar36 + iVar35];
      puVar15 = local_210 + 1;
      puVar14 = local_210;
      if (puVar15 < puVar10) {
        do {
          puVar27 = local_210;
          bVar28 = bVar11;
          if ((bVar11 != T[(long)PA[(int)*puVar15] + (long)iVar35]) &&
             (puVar27 = puVar15, bVar28 = T[(long)PA[(int)*puVar15] + (long)iVar35],
             4 < (long)(puVar14 + 1) - (long)local_210)) break;
          bVar11 = bVar28;
          local_210 = puVar27;
          puVar15 = puVar15 + 1;
          puVar14 = puVar14 + 1;
        } while (puVar15 < puVar10);
        lVar36 = (long)PA[(int)*local_210];
      }
      puVar14 = local_210;
      if (T[lVar36 + (long)iVar35 + -1] < bVar11) {
        puVar14 = local_210 + -1;
        puVar27 = puVar15;
        do {
          while ((puVar14 = puVar14 + 1, puVar14 < puVar27 &&
                 (uVar31 = *puVar14, PA[(long)(int)uVar31 + 1] < PA[(int)uVar31] + iVar35))) {
            *puVar14 = ~uVar31;
          }
          do {
            puVar27 = puVar27 + -1;
            if (puVar27 <= puVar14) {
              if (local_210 < puVar14) {
                *local_210 = ~*local_210;
              }
              goto LAB_001dd8aa;
            }
            uVar31 = *puVar27;
          } while (PA[(int)uVar31] + iVar35 <= PA[(long)(int)uVar31 + 1]);
          *puVar27 = *puVar14;
          *puVar14 = ~uVar31;
        } while( true );
      }
LAB_001dd8aa:
      uVar41 = (long)puVar15 - (long)puVar14;
      uVar39 = (long)uVar41 >> 2;
      lVar36 = (long)puVar10 - (long)puVar15 >> 2;
      bVar11 = (byte)(uVar39 >> 8);
      first = (int *)puVar15;
      if (lVar36 < (long)uVar39) {
        if (1 < lVar36) {
          if (0xf < iVar34) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb678,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar36 = (long)iVar34;
          auStack_1b8[lVar36 * 3] = (ulong)puVar14;
          auStack_1b8[lVar36 * 3 + 1] = (ulong)puVar15;
          aiStack_1a8[lVar36 * 6] = iVar35 + 1;
          if ((uVar41 & 0x3fc00) == 0) {
            iVar29 = lg_table[uVar39 & 0xff];
          }
          else {
            iVar29 = lg_table[bVar11] + 8;
          }
          uVar22 = (ulong)(iVar34 + 1);
          aiStack_1a8[lVar36 * 6 + 1] = iVar29;
          iVar29 = -1;
          goto LAB_001dcb68;
        }
      }
      else {
        iVar29 = -1;
        if ((long)uVar39 < 2) goto LAB_001dcb68;
        if (0xf < iVar34) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb671,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        lVar36 = (long)iVar34;
        auStack_1b8[lVar36 * 3] = (ulong)puVar15;
        auStack_1b8[lVar36 * 3 + 1] = (ulong)puVar10;
        aiStack_1a8[lVar36 * 6] = iVar35;
        uVar22 = (ulong)(iVar34 + 1);
        aiStack_1a8[lVar36 * 6 + 1] = -1;
      }
      iVar35 = iVar35 + 1;
      first = (int *)puVar14;
      last = (int *)puVar15;
      if ((uVar41 & 0x3fc00) == 0) {
        iVar29 = lg_table[uVar39 & 0xff];
      }
      else {
        iVar29 = lg_table[bVar11] + 8;
      }
      goto LAB_001dcb68;
    }
    uVar31 = (uint)(uVar41 >> 2);
    puVar15 = local_210 + ((int)(((uint)(uVar41 >> 0x21) & 1) + uVar31) >> 1);
    if ((int)uVar31 < 0x201) {
      if ((int)uVar31 < 0x21) {
        uVar17 = *local_210;
        bVar11 = T[(long)PA[(int)uVar17] + (long)iVar35];
        uVar31 = *puVar15;
        bVar28 = T[(long)PA[(int)uVar31] + (long)iVar35];
        puVar20 = puVar15;
        uVar3 = uVar31;
        if (bVar28 < bVar11) {
          puVar20 = local_210;
          uVar3 = uVar17;
        }
        if (T[(long)PA[(int)puVar10[-1]] + (long)iVar35] < T[(long)PA[(int)uVar3] + (long)iVar35]) {
          uVar3 = uVar17;
          if (bVar28 < bVar11) {
            uVar3 = uVar31;
          }
          if (bVar11 <= bVar28) {
            puVar15 = local_210;
          }
          puVar20 = puVar15;
          if (T[(long)PA[(int)uVar3] + (long)iVar35] <= T[(long)PA[(int)puVar10[-1]] + (long)iVar35]
             ) {
            puVar20 = puVar10 + -1;
          }
        }
      }
      else {
        uVar39 = (ulong)(uint)((int)(uVar41 >> 4) << 2);
        puVar14 = puVar10 + -1;
        puVar23 = (uint *)((long)puVar14 - uVar39);
        uVar31 = *(uint *)((long)local_210 + uVar39);
        puVar27 = (uint *)((long)local_210 + uVar39);
        puVar40 = puVar15;
        if (T[(long)PA[(int)*puVar15] + (long)iVar35] < T[(long)PA[(int)uVar31] + (long)iVar35]) {
          puVar40 = puVar27;
          uVar31 = *puVar15;
          puVar27 = puVar15;
        }
        uVar17 = *puVar23;
        puVar15 = puVar14;
        if (T[(long)PA[(int)puVar10[-1]] + (long)iVar35] < T[(long)PA[(int)uVar17] + (long)iVar35])
        {
          puVar15 = puVar23;
          uVar17 = puVar10[-1];
          puVar23 = puVar14;
        }
        puVar14 = puVar15;
        if (T[(long)PA[(int)uVar17] + (long)iVar35] < T[(long)PA[(int)uVar31] + (long)iVar35]) {
          puVar14 = puVar40;
          puVar40 = puVar15;
          puVar23 = puVar27;
        }
        uVar17 = *local_210;
        puVar15 = puVar40;
        uVar31 = uVar17;
        puVar20 = local_210;
        if (T[(long)PA[(int)*puVar40] + (long)iVar35] < T[(long)PA[(int)uVar17] + (long)iVar35]) {
          puVar15 = local_210;
          uVar31 = *puVar40;
          puVar20 = puVar40;
        }
        if (T[(long)PA[(int)uVar31] + (long)iVar35] <= T[(long)PA[(int)*puVar23] + (long)iVar35]) {
          puVar20 = puVar23;
          puVar14 = puVar15;
        }
        if (T[(long)PA[(int)*puVar14] + (long)iVar35] <= T[(long)PA[(int)*puVar20] + (long)iVar35])
        {
          puVar20 = puVar14;
        }
      }
    }
    else {
      uVar39 = uVar41 >> 5 & 0x1fffffff;
      puVar14 = local_210 + uVar39;
      uVar17 = *local_210;
      uVar3 = *puVar14;
      local_1d0 = puVar14;
      uVar5 = uVar3;
      if (T[(long)PA[(int)uVar3] + (long)iVar35] < T[(long)PA[(int)uVar17] + (long)iVar35]) {
        local_1d0 = local_210;
        uVar5 = uVar17;
      }
      if (T[(long)PA[*(int *)((long)local_210 + (ulong)(uVar31 & 0xfffffff8))] + (long)iVar35] <
          T[(long)PA[(int)uVar5] + (long)iVar35]) {
        if (T[(long)PA[(int)uVar17] + (long)iVar35] <= T[(long)PA[(int)uVar3] + (long)iVar35]) {
          puVar14 = local_210;
          uVar3 = uVar17;
        }
        local_1d0 = puVar14;
        if (T[(long)PA[(int)uVar3] + (long)iVar35] <=
            T[(long)PA[*(int *)((long)local_210 + (ulong)(uVar31 & 0xfffffff8))] + (long)iVar35]) {
          local_1d0 = (uint *)((ulong)(uVar31 & 0xfffffff8) + (long)local_210);
        }
      }
      uVar41 = (ulong)(uint)((int)uVar39 * 4);
      puVar14 = (uint *)((long)puVar15 - uVar41);
      uVar31 = *puVar14;
      uVar3 = *puVar15;
      puVar27 = puVar15;
      uVar5 = uVar3;
      if (T[(long)PA[(int)uVar3] + (long)iVar35] < T[(long)PA[(int)uVar31] + (long)iVar35]) {
        puVar27 = puVar14;
        uVar5 = uVar31;
      }
      if (T[(long)PA[*(int *)((long)puVar15 + uVar41)] + (long)iVar35] <
          T[(long)PA[(int)uVar5] + (long)iVar35]) {
        if (T[(long)PA[(int)uVar3] + (long)iVar35] < T[(long)PA[(int)uVar31] + (long)iVar35]) {
          puVar14 = puVar15;
          uVar31 = uVar3;
        }
        puVar27 = puVar14;
        if (T[(long)PA[(int)uVar31] + (long)iVar35] <=
            T[(long)PA[*(int *)((long)puVar15 + uVar41)] + (long)iVar35]) {
          puVar27 = (uint *)(uVar41 + (long)puVar15);
        }
      }
      puVar15 = (uint *)((long)(puVar10 + -1) - (ulong)(uint)((int)uVar39 << 3));
      puVar20 = puVar10 + (-1 - uVar39);
      uVar31 = *puVar15;
      uVar3 = *puVar20;
      puVar14 = puVar20;
      uVar5 = uVar3;
      if (T[(long)PA[(int)uVar3] + (long)iVar35] < T[(long)PA[(int)uVar31] + (long)iVar35]) {
        puVar14 = puVar15;
        uVar5 = uVar31;
      }
      bVar11 = T[(long)PA[(int)uVar5] + (long)iVar35];
      if (T[(long)PA[(int)puVar10[-1]] + (long)iVar35] < bVar11) {
        if (T[(long)PA[(int)uVar3] + (long)iVar35] < T[(long)PA[(int)uVar31] + (long)iVar35]) {
          puVar15 = puVar20;
          uVar31 = uVar3;
        }
        puVar14 = puVar10 + -1;
        if (T[(long)PA[(int)puVar10[-1]] + (long)iVar35] < T[(long)PA[(int)uVar31] + (long)iVar35])
        {
          puVar14 = puVar15;
        }
        bVar11 = T[(long)PA[(int)*puVar14] + (long)iVar35];
      }
      uVar31 = *local_1d0;
      uVar3 = *puVar27;
      puVar20 = puVar27;
      uVar5 = uVar3;
      if (T[(long)PA[(int)uVar3] + (long)iVar35] < T[(long)PA[(int)uVar31] + (long)iVar35]) {
        puVar20 = local_1d0;
        uVar5 = uVar31;
      }
      if (bVar11 < T[(long)PA[(int)uVar5] + (long)iVar35]) {
        if (T[(long)PA[(int)uVar3] + (long)iVar35] < T[(long)PA[(int)uVar31] + (long)iVar35]) {
          local_1d0 = puVar27;
          uVar31 = uVar3;
        }
        puVar20 = puVar14;
        if (bVar11 < T[(long)PA[(int)uVar31] + (long)iVar35]) {
          puVar20 = local_1d0;
        }
      }
    }
    bVar11 = T[(long)PA[(int)*puVar20] + (long)iVar35];
    *local_210 = *puVar20;
    *puVar20 = uVar17;
    puVar15 = local_210;
    do {
      puVar15 = puVar15 + 1;
      puVar27 = puVar10;
      puVar14 = puVar15;
      if (puVar10 <= puVar15) goto LAB_001dd47e;
    } while (T[(long)PA[(int)*puVar15] + (long)iVar35] == bVar11);
    if (T[(long)PA[(int)*puVar15] + (long)iVar35] < bVar11) {
      while (puVar14 = puVar14 + 1, puVar14 < puVar10) {
        uVar31 = *puVar14;
        if (bVar11 < T[(long)PA[(int)uVar31] + (long)iVar35]) break;
        if (T[(long)PA[(int)uVar31] + (long)iVar35] == bVar11) {
          *puVar14 = *puVar15;
          *puVar15 = uVar31;
          puVar15 = puVar15 + 1;
        }
      }
    }
LAB_001dd47e:
    do {
      puVar20 = puVar27;
      puVar27 = puVar20 + -1;
      puVar23 = puVar27;
      if (puVar27 <= puVar14) goto LAB_001dd533;
    } while (T[(long)PA[(int)*puVar27] + (long)iVar35] == bVar11);
    if (bVar11 < T[(long)PA[(int)*puVar27] + (long)iVar35]) {
      for (puVar20 = puVar20 + -2; puVar27 = puVar20, puVar14 < puVar20; puVar20 = puVar20 + -1) {
        uVar31 = *puVar20;
        if (T[(long)PA[(int)uVar31] + (long)iVar35] < bVar11) break;
        if (T[(long)PA[(int)uVar31] + (long)iVar35] == bVar11) {
          *puVar20 = *puVar23;
          *puVar23 = uVar31;
          puVar23 = puVar23 + -1;
        }
      }
    }
LAB_001dd533:
    if (puVar14 < puVar27) {
      uVar31 = *puVar14;
      *puVar14 = *puVar27;
      *puVar27 = uVar31;
      while (puVar14 = puVar14 + 1, puVar14 < puVar27) {
        uVar31 = *puVar14;
        if (bVar11 < T[(long)PA[(int)uVar31] + (long)iVar35]) break;
        if (T[(long)PA[(int)uVar31] + (long)iVar35] == bVar11) {
          *puVar14 = *puVar15;
          *puVar15 = uVar31;
          puVar15 = puVar15 + 1;
        }
      }
LAB_001dd51c:
      puVar27 = puVar27 + -1;
      if (puVar14 < puVar27) {
        uVar31 = *puVar27;
        if (T[(long)PA[(int)uVar31] + (long)iVar35] < bVar11) goto LAB_001dd533;
        if (T[(long)PA[(int)uVar31] + (long)iVar35] == bVar11) {
          *puVar27 = *puVar23;
          *puVar23 = uVar31;
          puVar23 = puVar23 + -1;
        }
        goto LAB_001dd51c;
      }
      goto LAB_001dd533;
    }
    if (puVar23 < puVar15) {
      iVar29 = iVar13;
      if (T[(long)PA[(int)*local_210] + (long)iVar35 + -1] < bVar11) {
        puVar14 = local_210 + -1;
        puVar15 = puVar10;
        do {
          while ((puVar14 = puVar14 + 1, puVar14 < puVar15 &&
                 (uVar31 = *puVar14, PA[(long)(int)uVar31 + 1] < PA[(int)uVar31] + iVar35))) {
            *puVar14 = ~uVar31;
          }
          do {
            puVar15 = puVar15 + -1;
            if (puVar15 <= puVar14) {
              if (local_210 < puVar14) {
                *local_210 = ~*local_210;
              }
              uVar31 = (uint)((long)puVar10 - (long)puVar14);
              local_210 = puVar14;
              if (((long)puVar10 - (long)puVar14 & 0x3fc00U) == 0) {
                iVar29 = *(int *)((long)lg_table + (ulong)(uVar31 & 0x3fc));
              }
              else {
                iVar29 = *(int *)((long)lg_table + (ulong)(uVar31 >> 8 & 0x3fc)) + 8;
              }
              goto LAB_001ddc58;
            }
            uVar31 = *puVar15;
          } while (PA[(int)uVar31] + iVar35 <= PA[(long)(int)uVar31 + 1]);
          *puVar15 = *puVar14;
          *puVar14 = ~uVar31;
        } while( true );
      }
LAB_001ddc58:
      iVar35 = iVar35 + 1;
      first = (int *)local_210;
    }
    else {
      lVar36 = (long)puVar14 - (long)puVar15 >> 2;
      uVar31 = (uint)((ulong)((long)puVar15 - (long)local_210) >> 2);
      if ((int)(uint)lVar36 <= (int)uVar31) {
        uVar31 = (uint)lVar36;
      }
      if (0 < (int)uVar31) {
        uVar17 = uVar31 + 1;
        lVar42 = 0;
        do {
          uVar4 = *(undefined4 *)((long)local_210 + lVar42);
          *(undefined4 *)((long)local_210 + lVar42) =
               *(undefined4 *)((long)puVar14 + lVar42 + (ulong)uVar31 * -4);
          *(undefined4 *)((long)puVar14 + lVar42 + (ulong)uVar31 * -4) = uVar4;
          uVar17 = uVar17 - 1;
          lVar42 = lVar42 + 4;
        } while (1 < uVar17);
      }
      lVar42 = (long)puVar23 - (long)(puVar14 + -1) >> 2;
      uVar31 = (int)((ulong)((long)puVar10 - (long)puVar23) >> 2) - 1;
      if ((int)(uint)lVar42 <= (int)uVar31) {
        uVar31 = (uint)lVar42;
      }
      if (0 < (int)uVar31) {
        uVar17 = uVar31 + 1;
        lVar16 = 0;
        do {
          uVar4 = *(undefined4 *)((long)puVar14 + lVar16);
          *(undefined4 *)((long)puVar14 + lVar16) =
               *(undefined4 *)((long)puVar10 + lVar16 + (ulong)uVar31 * -4);
          *(undefined4 *)((long)puVar10 + lVar16 + (ulong)uVar31 * -4) = uVar4;
          uVar17 = uVar17 - 1;
          lVar16 = lVar16 + 4;
        } while (1 < uVar17);
      }
      puVar15 = local_210 + lVar36;
      last = (int *)(puVar10 + -lVar42);
      first = (int *)puVar15;
      if (T[(long)PA[(int)*puVar15] + (long)iVar35 + -1] < bVar11) {
        first = (int *)(puVar15 + -1);
        puVar14 = (uint *)last;
        do {
          while ((first = (int *)((uint *)first + 1), first < puVar14 &&
                 (uVar31 = *first, PA[(long)(int)uVar31 + 1] < PA[(int)uVar31] + iVar35))) {
            *first = ~uVar31;
          }
          do {
            puVar14 = puVar14 + -1;
            if (puVar14 <= first) {
              if (puVar15 < first) {
                *puVar15 = ~*puVar15;
              }
              goto LAB_001dd67b;
            }
            uVar31 = *puVar14;
          } while (PA[(int)uVar31] + iVar35 <= PA[(long)(int)uVar31 + 1]);
          *puVar14 = *first;
          *first = ~uVar31;
        } while( true );
      }
LAB_001dd67b:
      uVar41 = (long)last - (long)first;
      uVar39 = (long)uVar41 >> 2;
      bVar11 = (byte)(uVar39 >> 8);
      if (lVar42 < lVar36) {
        if ((long)uVar39 < lVar36) {
          if ((long)uVar39 < lVar42) {
            if (0xf < iVar34) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb6c0,
                            "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                           );
            }
            lVar36 = (long)iVar34;
            auStack_1b8[lVar36 * 3] = (ulong)local_210;
            auStack_1b8[lVar36 * 3 + 1] = (ulong)puVar15;
            aiStack_1a8[lVar36 * 6] = iVar35;
            aiStack_1a8[lVar36 * 6 + 1] = iVar29;
            if (iVar34 == 0xf) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb6c1,
                            "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                           );
            }
            lVar36 = (long)(iVar34 + 1);
            auStack_1b8[lVar36 * 3] = (ulong)last;
            auStack_1b8[lVar36 * 3 + 1] = (ulong)puVar10;
            aiStack_1a8[lVar36 * 6] = iVar35;
            aiStack_1a8[lVar36 * 6 + 1] = iVar29;
            goto LAB_001dd75e;
          }
          if (0xf < iVar34) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6bc,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar36 = (long)iVar34;
          auStack_1b8[lVar36 * 3] = (ulong)local_210;
          auStack_1b8[lVar36 * 3 + 1] = (ulong)puVar15;
          aiStack_1a8[lVar36 * 6] = iVar35;
          aiStack_1a8[lVar36 * 6 + 1] = iVar29;
          if (iVar34 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6bd,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar36 = (long)(iVar34 + 1);
          auStack_1b8[lVar36 * 3] = (ulong)first;
          auStack_1b8[lVar36 * 3 + 1] = (ulong)last;
          aiStack_1a8[lVar36 * 6] = iVar35 + 1;
          if ((uVar41 & 0x3fc00) == 0) {
            iVar13 = lg_table[uVar39 & 0xff];
          }
          else {
            iVar13 = lg_table[bVar11] + 8;
          }
          aiStack_1a8[lVar36 * 6 + 1] = iVar13;
        }
        else {
          if (0xf < iVar34) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6b8,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar36 = (long)iVar34;
          auStack_1b8[lVar36 * 3] = (ulong)first;
          auStack_1b8[lVar36 * 3 + 1] = (ulong)last;
          aiStack_1a8[lVar36 * 6] = iVar35 + 1;
          if ((uVar41 & 0x3fc00) == 0) {
            iVar13 = lg_table[uVar39 & 0xff];
          }
          else {
            iVar13 = lg_table[bVar11] + 8;
          }
          aiStack_1a8[lVar36 * 6 + 1] = iVar13;
          if (iVar34 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6b9,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar36 = (long)(iVar34 + 1);
          auStack_1b8[lVar36 * 3] = (ulong)local_210;
          auStack_1b8[lVar36 * 3 + 1] = (ulong)puVar15;
          aiStack_1a8[lVar36 * 6] = iVar35;
          aiStack_1a8[lVar36 * 6 + 1] = iVar29;
        }
        uVar22 = (ulong)(iVar34 + 2);
        first = last;
        last = (int *)puVar10;
      }
      else if ((long)uVar39 < lVar42) {
        if ((long)uVar39 < lVar36) {
          if (0xf < iVar34) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6b2,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar36 = (long)iVar34;
          auStack_1b8[lVar36 * 3] = (ulong)last;
          auStack_1b8[lVar36 * 3 + 1] = (ulong)puVar10;
          aiStack_1a8[lVar36 * 6] = iVar35;
          aiStack_1a8[lVar36 * 6 + 1] = iVar29;
          if (iVar34 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6b3,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar36 = (long)(iVar34 + 1);
          auStack_1b8[lVar36 * 3] = (ulong)local_210;
          auStack_1b8[lVar36 * 3 + 1] = (ulong)puVar15;
          aiStack_1a8[lVar36 * 6] = iVar35;
          aiStack_1a8[lVar36 * 6 + 1] = iVar29;
LAB_001dd75e:
          uVar22 = (ulong)(iVar34 + 2);
          iVar35 = iVar35 + 1;
          if ((uVar41 & 0x3fc00) == 0) {
            iVar29 = lg_table[uVar39 & 0xff];
          }
          else {
            iVar29 = lg_table[bVar11] + 8;
          }
        }
        else {
          if (0xf < iVar34) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6ae,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar36 = (long)iVar34;
          auStack_1b8[lVar36 * 3] = (ulong)last;
          auStack_1b8[lVar36 * 3 + 1] = (ulong)puVar10;
          aiStack_1a8[lVar36 * 6] = iVar35;
          aiStack_1a8[lVar36 * 6 + 1] = iVar29;
          if (iVar34 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6af,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar36 = (long)(iVar34 + 1);
          auStack_1b8[lVar36 * 3] = (ulong)first;
          auStack_1b8[lVar36 * 3 + 1] = (ulong)last;
          aiStack_1a8[lVar36 * 6] = iVar35 + 1;
          if ((uVar41 & 0x3fc00) == 0) {
            iVar13 = lg_table[uVar39 & 0xff];
          }
          else {
            iVar13 = lg_table[bVar11] + 8;
          }
          uVar22 = (ulong)(iVar34 + 2);
          aiStack_1a8[lVar36 * 6 + 1] = iVar13;
          first = (int *)local_210;
          last = (int *)puVar15;
        }
      }
      else {
        if (0xf < iVar34) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb6aa,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        lVar36 = (long)iVar34;
        auStack_1b8[lVar36 * 3] = (ulong)first;
        auStack_1b8[lVar36 * 3 + 1] = (ulong)last;
        aiStack_1a8[lVar36 * 6] = iVar35 + 1;
        if ((uVar41 & 0x3fc00) == 0) {
          iVar13 = lg_table[uVar39 & 0xff];
        }
        else {
          iVar13 = lg_table[bVar11] + 8;
        }
        aiStack_1a8[lVar36 * 6 + 1] = iVar13;
        if (iVar34 == 0xf) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb6ab,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        lVar36 = (long)(iVar34 + 1);
        auStack_1b8[lVar36 * 3] = (ulong)last;
        auStack_1b8[lVar36 * 3 + 1] = (ulong)puVar10;
        aiStack_1a8[lVar36 * 6] = iVar35;
        uVar22 = (ulong)(iVar34 + 2);
        aiStack_1a8[lVar36 * 6 + 1] = iVar29;
        first = (int *)local_210;
        last = (int *)puVar15;
      }
    }
  } while( true );
}

Assistant:

static
void
ss_mintrosort(const unsigned char *T, const int *PA,
              int *first, int *last,
              int depth) {
#define STACK_SIZE SS_MISORT_STACKSIZE
  struct { int *a, *b, c; int d; } stack[STACK_SIZE];
  const unsigned char *Td;
  int *a, *b, *c, *d, *e, *f;
  int s, t;
  int ssize;
  int limit;
  int v, x = 0;

  for(ssize = 0, limit = ss_ilg(last - first);;) {

    if((last - first) <= SS_INSERTIONSORT_THRESHOLD) {
#if 1 < SS_INSERTIONSORT_THRESHOLD
      if(1 < (last - first)) { ss_insertionsort(T, PA, first, last, depth); }
#endif
      STACK_POP(first, last, depth, limit);
      continue;
    }

    Td = T + depth;
    if(limit-- == 0) { ss_heapsort(Td, PA, first, last - first); }
    if(limit < 0) {
      for(a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if((x = Td[PA[*a]]) != v) {
          if(1 < (a - first)) { break; }
          v = x;
          first = a;
        }
      }
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, a, depth);
      }
      if((a - first) <= (last - a)) {
        if(1 < (a - first)) {
          STACK_PUSH(a, last, depth, -1);
          last = a, depth += 1, limit = ss_ilg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if(1 < (last - a)) {
          STACK_PUSH(first, a, depth + 1, ss_ilg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = ss_ilg(a - first);
        }
      }
      continue;
    }

    /* choose pivot */
    a = ss_pivot(Td, PA, first, last);
    v = Td[PA[*a]];
    SWAP(*first, *a);

    /* partition */
    for(b = first; (++b < last) && ((x = Td[PA[*b]]) == v);) { }
    if(((a = b) < last) && (x < v)) {
      for(; (++b < last) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
    }
    for(c = last; (b < --c) && ((x = Td[PA[*c]]) == v);) { }
    if((b < (d = c)) && (x > v)) {
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }
    for(; b < c;) {
      SWAP(*b, *c);
      for(; (++b < c) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }

    if(a <= d) {
      c = b - 1;

      if((s = a - first) > (t = b - a)) { s = t; }
      for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
      if((s = d - c) > (t = last - d - 1)) { s = t; }
      for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }

      a = first + (b - a), c = last - (d - c);
      b = (v <= Td[PA[*a] - 1]) ? a : ss_partition(PA, a, c, depth);

      if((a - first) <= (last - c)) {
        if((last - c) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(c, last, depth, limit);
          last = a;
        } else if((a - first) <= (c - b)) {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          last = a;
        } else {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      } else {
        if((a - first) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(first, a, depth, limit);
          first = c;
        } else if((last - c) <= (c - b)) {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          first = c;
        } else {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      }
    } else {
      limit += 1;
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, last, depth);
        limit = ss_ilg(last - first);
      }
      depth += 1;
    }
  }
#undef STACK_SIZE
}